

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

boolean jt_read_integer(char **strptr,JDIMENSION *result)

{
  boolean bVar1;
  ushort **ppuVar2;
  long lVar3;
  JDIMENSION JVar4;
  char *pcVar5;
  
  pcVar5 = *strptr;
  ppuVar2 = __ctype_b_loc();
  lVar3 = (long)*pcVar5;
  if ((*(byte *)((long)*ppuVar2 + lVar3 * 2 + 1) & 8) == 0) {
    *result = 0;
    bVar1 = 0;
  }
  else {
    JVar4 = 0;
    do {
      JVar4 = ((int)(char)lVar3 + JVar4 * 10) - 0x30;
      lVar3 = (long)pcVar5[1];
      pcVar5 = pcVar5 + 1;
    } while ((*(byte *)((long)*ppuVar2 + lVar3 * 2 + 1) & 8) != 0);
    *result = JVar4;
    *strptr = pcVar5;
    bVar1 = 1;
  }
  return bVar1;
}

Assistant:

LOCAL(boolean)
jt_read_integer(const char **strptr, JDIMENSION *result)
{
  const char *ptr = *strptr;
  JDIMENSION val = 0;

  for (; isdigit(*ptr); ptr++) {
    val = val * 10 + (JDIMENSION)(*ptr - '0');
  }
  *result = val;
  if (ptr == *strptr)
    return FALSE;               /* oops, no digits */
  *strptr = ptr;
  return TRUE;
}